

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

SchemaType * __thiscall
CoreML::Model::outputSchema_abi_cxx11_(SchemaType *__return_storage_ptr__,Model *this)

{
  int iVar1;
  Type *pTVar2;
  FeatureType *__b;
  int index;
  ModelDescription *pMVar3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>
  local_a8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::FeatureType>
  local_78;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pMVar3 = ((this->m_spec).
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
           description_;
  if (pMVar3 == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)&Specification::_ModelDescription_default_instance_;
  }
  iVar1 = (pMVar3->output_).super_RepeatedPtrFieldBase.current_size_;
  if (-1 < (long)iVar1) {
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>_>_>
    ::reserve(__return_storage_ptr__,(long)iVar1);
    if (iVar1 != 0) {
      index = 0;
      do {
        pTVar2 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                           (&(pMVar3->output_).super_RepeatedPtrFieldBase,index);
        __b = pTVar2->type_;
        if (__b == (FeatureType *)0x0) {
          __b = (FeatureType *)&Specification::_FeatureType_default_instance_;
        }
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::FeatureType>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::FeatureType,_true>
                  (&local_78,(pTVar2->name_).ptr_,__b);
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::FeatureType>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::FeatureType,_true>
                  (&local_a8,&local_78);
        std::
        vector<std::pair<std::__cxx11::string,CoreML::FeatureType>,std::allocator<std::pair<std::__cxx11::string,CoreML::FeatureType>>>
        ::emplace_back<std::pair<std::__cxx11::string,CoreML::FeatureType>>
                  ((vector<std::pair<std::__cxx11::string,CoreML::FeatureType>,std::allocator<std::pair<std::__cxx11::string,CoreML::FeatureType>>>
                    *)__return_storage_ptr__,&local_a8);
        if (local_a8.second.m_type.
            super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.second.m_type.
                     super___shared_ptr<CoreML::Specification::FeatureType,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8.first._M_dataplus._M_p != &local_a8.first.field_2) {
          operator_delete(local_a8.first._M_dataplus._M_p,
                          local_a8.first.field_2._M_allocated_capacity + 1);
        }
        Specification::FeatureType::~FeatureType(&local_78.second);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78.first._M_dataplus._M_p != &local_78.first.field_2) {
          operator_delete(local_78.first._M_dataplus._M_p,
                          local_78.first.field_2._M_allocated_capacity + 1);
        }
        index = index + 1;
      } while (iVar1 != index);
    }
    return __return_storage_ptr__;
  }
  __assert_fail("size >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/src/Model.cpp"
                ,199,"SchemaType CoreML::Model::outputSchema() const");
}

Assistant:

SchemaType Model::outputSchema() const {
        SchemaType outputs;
        const Specification::ModelDescription& interface = m_spec->description();
        int size = interface.output_size();
        assert(size >= 0);
        outputs.reserve(static_cast<size_t>(size));
        for (int i = 0; i < size; i++) {
            const Specification::FeatureDescription &desc = interface.output(i);
            outputs.push_back(std::make_pair(desc.name(), desc.type()));
        }
        return outputs;
    }